

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_GiveToSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *receiver;
  AActor *u_00;
  bool bVar1;
  bool local_6b;
  int local_64;
  int u;
  int count;
  AActor *mo;
  TThinkerIterator<AActor> it;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x998,
                  "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    it.super_FThinkerIterator._16_8_ = *(undefined8 *)&param->field_0;
    local_6b = true;
    if ((DObject *)it.super_FThinkerIterator._16_8_ != (DObject *)0x0) {
      local_6b = DObject::IsKindOf((DObject *)it.super_FThinkerIterator._16_8_,
                                   AActor::RegistrationInfo.MyClass);
    }
    if (local_6b != false) {
      TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
      local_64 = 0;
      bVar1 = TObjPtr<AActor>::operator!=
                        ((TObjPtr<AActor> *)(it.super_FThinkerIterator._16_8_ + 0x280),(AActor *)0x0
                        );
      if (bVar1) {
        while (receiver = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo,false),
              receiver != (AActor *)0x0) {
          u_00 = TObjPtr::operator_cast_to_AActor_
                           ((TObjPtr *)(it.super_FThinkerIterator._16_8_ + 0x280));
          bVar1 = TObjPtr<AActor>::operator==(&receiver->master,u_00);
          if ((bVar1) && (receiver != (AActor *)it.super_FThinkerIterator._16_8_)) {
            bVar1 = DoGiveInventory(receiver,true,param,defaultparam,numparam,ret,numret);
            local_64 = (uint)bVar1 + local_64;
          }
        }
      }
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x9a8,
                        "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,local_64);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x998,
                  "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x998,
                "int AF_AActor_A_GiveToSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveToSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<AActor> it;
	AActor *mo;
	int count = 0;

	if (self->master != NULL)
	{
		while ((mo = it.Next()))
		{
			if (mo->master == self->master && mo != self)
			{
				count += DoGiveInventory(mo, true, VM_ARGS_NAMES);
			}
		}
	}
	ACTION_RETURN_INT(count);
}